

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::contextCallbackOverrideCleanup
          (CLIntercept *this,cl_context context,SContextCallbackInfo **pContextCallbackInfo,
          cl_context_properties **pLocalContextProperties)

{
  mapped_type pSVar1;
  mapped_type *ppSVar2;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  SContextCallbackInfo *pOldContextCallbackInfo;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  key_type *in_stack_ffffffffffffffc8;
  map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
  *in_stack_ffffffffffffffd0;
  mapped_type this_00;
  
  if ((in_RSI == 0) || (*in_RDX == 0)) {
    if ((void *)*in_RDX != (void *)0x0) {
      operator_delete((void *)*in_RDX);
    }
    *in_RDX = 0;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    ppSVar2 = std::
              map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
              ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    this_00 = *ppSVar2;
    if (this_00 != (mapped_type)0x0) {
      if (this_00 != (mapped_type)0x0) {
        operator_delete(this_00);
      }
      this_00 = (mapped_type)0x0;
    }
    pSVar1 = (mapped_type)*in_RDX;
    ppSVar2 = std::
              map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
              ::operator[]((map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
                            *)this_00,in_stack_ffffffffffffffc8);
    *ppSVar2 = pSVar1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f7625);
  }
  if (*in_RCX != 0) {
    if ((void *)*in_RCX != (void *)0x0) {
      operator_delete((void *)*in_RCX);
    }
    *in_RCX = 0;
  }
  return;
}

Assistant:

void CLIntercept::contextCallbackOverrideCleanup(
    const cl_context context,
    SContextCallbackInfo*& pContextCallbackInfo,
    cl_context_properties*& pLocalContextProperties )
{
    if( context && pContextCallbackInfo )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        // Check if we already have a context callback info for this context.  If
        // we do, free it.
        SContextCallbackInfo* pOldContextCallbackInfo =
            m_ContextCallbackInfoMap[ context ];
        if( pOldContextCallbackInfo )
        {
            delete pOldContextCallbackInfo;
            pOldContextCallbackInfo = NULL;
        }

        m_ContextCallbackInfoMap[ context ]  = pContextCallbackInfo;
    }
    else
    {
        delete pContextCallbackInfo;
        pContextCallbackInfo = NULL;
    }

    if( pLocalContextProperties )
    {
        delete pLocalContextProperties;
        pLocalContextProperties = NULL;
    }
}